

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void baryonyx::itm::
     init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>
               (bit_array *x_pessimistic,bit_array *x_optimistic,random_engine *rng,
               default_cost_type<float> *c,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *constraints,double init_random)

{
  pointer pmVar1;
  pointer pfVar2;
  float *pfVar3;
  function_element fVar4;
  bool bVar5;
  byte bVar6;
  undefined1 auVar7 [16];
  pointer prVar8;
  pointer prVar9;
  bit_array_impl *pbVar10;
  random_engine *prVar11;
  pointer pmVar12;
  ulong uVar13;
  function_element *pfVar14;
  int *piVar15;
  long unaff_RBX;
  merged_constraint *cst;
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  size_type __n;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  ulong uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  double dVar34;
  undefined1 auVar35 [64];
  vector<reduced_cost,_std::allocator<reduced_cost>_> R;
  allocator_type local_79;
  ulong local_78;
  vector<reduced_cost,_std::allocator<reduced_cost>_> local_70;
  bit_array_impl *local_58;
  random_engine *local_50;
  default_cost_type<float> *local_48;
  pointer local_40;
  double local_38;
  undefined1 auVar28 [32];
  
  pmVar12 = (constraints->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pmVar1 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar12 == pmVar1) {
    __n = 0;
  }
  else {
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx2(_DAT_00622f60);
    lVar18 = -0x28 - (long)pmVar12;
    uVar13 = 0;
    auVar30 = vpbroadcastq_avx512f();
    auVar31 = vpsrlq_avx512f(auVar30,5);
    auVar30 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar35 = auVar30;
      auVar30 = vpbroadcastq_avx512f();
      uVar13 = uVar13 + 8;
      auVar30 = vporq_avx512f(auVar30,auVar29);
      uVar24 = vpcmpuq_avx512f(auVar30,auVar31,2);
      auVar30 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pmVar12->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + unaff_RBX))
      ;
      bVar6 = (byte)uVar24;
      auVar32._8_8_ = (ulong)((byte)(uVar24 >> 1) & 1) * auVar30._8_8_;
      auVar32._0_8_ = (ulong)(bVar6 & 1) * auVar30._0_8_;
      auVar32._16_8_ = (ulong)((byte)(uVar24 >> 2) & 1) * auVar30._16_8_;
      auVar32._24_8_ = (ulong)((byte)(uVar24 >> 3) & 1) * auVar30._24_8_;
      auVar32._32_8_ = (ulong)((byte)(uVar24 >> 4) & 1) * auVar30._32_8_;
      auVar32._40_8_ = (ulong)((byte)(uVar24 >> 5) & 1) * auVar30._40_8_;
      auVar32._48_8_ = (ulong)((byte)(uVar24 >> 6) & 1) * auVar30._48_8_;
      auVar32._56_8_ = (uVar24 >> 7) * auVar30._56_8_;
      auVar30 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pmVar12->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_start + unaff_RBX));
      auVar33._8_8_ = (ulong)((byte)(uVar24 >> 1) & 1) * auVar30._8_8_;
      auVar33._0_8_ = (ulong)(bVar6 & 1) * auVar30._0_8_;
      auVar33._16_8_ = (ulong)((byte)(uVar24 >> 2) & 1) * auVar30._16_8_;
      auVar33._24_8_ = (ulong)((byte)(uVar24 >> 3) & 1) * auVar30._24_8_;
      auVar33._32_8_ = (ulong)((byte)(uVar24 >> 4) & 1) * auVar30._32_8_;
      auVar33._40_8_ = (ulong)((byte)(uVar24 >> 5) & 1) * auVar30._40_8_;
      auVar33._48_8_ = (ulong)((byte)(uVar24 >> 6) & 1) * auVar30._48_8_;
      auVar33._56_8_ = (uVar24 >> 7) * auVar30._56_8_;
      pmVar12 = pmVar12 + 8;
      auVar30 = vpsubq_avx512f(auVar32,auVar33);
      auVar30 = vpsrlq_avx512f(auVar30,3);
      auVar27 = vpmovqd_avx512f(auVar30);
      auVar27 = vpmaxsd_avx2(auVar35._0_32_,auVar27);
      auVar30 = ZEXT3264(auVar27);
    } while (((ulong)((long)pmVar1 + lVar18) / 0x28 + 8 & 0xfffffffffffffff8) != uVar13);
    auVar27 = vmovdqa32_avx512vl(auVar27);
    auVar26._0_4_ = (uint)(bVar6 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar35._0_4_;
    bVar5 = (bool)((byte)(uVar24 >> 1) & 1);
    auVar26._4_4_ = (uint)bVar5 * auVar27._4_4_ | (uint)!bVar5 * auVar35._4_4_;
    bVar5 = (bool)((byte)(uVar24 >> 2) & 1);
    auVar26._8_4_ = (uint)bVar5 * auVar27._8_4_ | (uint)!bVar5 * auVar35._8_4_;
    bVar5 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar26._12_4_ = (uint)bVar5 * auVar27._12_4_ | (uint)!bVar5 * auVar35._12_4_;
    bVar5 = (bool)((byte)(uVar24 >> 4) & 1);
    auVar28._16_4_ = (uint)bVar5 * auVar27._16_4_ | (uint)!bVar5 * auVar35._16_4_;
    auVar28._0_16_ = auVar26;
    bVar5 = (bool)((byte)(uVar24 >> 5) & 1);
    auVar28._20_4_ = (uint)bVar5 * auVar27._20_4_ | (uint)!bVar5 * auVar35._20_4_;
    bVar5 = (bool)((byte)(uVar24 >> 6) & 1);
    auVar28._24_4_ = (uint)bVar5 * auVar27._24_4_ | (uint)!bVar5 * auVar35._24_4_;
    bVar5 = SUB81(uVar24 >> 7,0);
    auVar28._28_4_ = (uint)bVar5 * auVar27._28_4_ | (uint)!bVar5 * auVar35._28_4_;
    auVar26 = vpmaxsd_avx(auVar26,auVar28._16_16_);
    auVar7 = vpshufd_avx(auVar26,0xee);
    auVar26 = vpmaxsd_avx(auVar26,auVar7);
    auVar7 = vpshufd_avx(auVar26,0x55);
    auVar26 = vpmaxsd_avx(auVar26,auVar7);
    __n = CONCAT44((int)((ulong)x_optimistic >> 0x20),auVar26._0_4_);
  }
  local_58 = &x_pessimistic->super_bit_array_impl;
  local_48 = c;
  local_38 = init_random;
  std::vector<reduced_cost,_std::allocator<reduced_cost>_>::vector(&local_70,__n,&local_79);
  local_40 = (constraints->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pmVar12 = (constraints->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  prVar11 = rng;
  if (pmVar12 != local_40) {
    do {
      local_50 = prVar11;
      dVar34 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
      if (dVar34 < local_38) {
        std::vector<reduced_cost,_std::allocator<reduced_cost>_>::resize
                  (&local_70,
                   (long)(pmVar12->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar12->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        pfVar2 = (pmVar12->elements).
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_78 = (ulong)((long)(pmVar12->elements).
                                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar2) >> 3;
        if ((int)local_78 != 0) {
          uVar13 = 0;
          pfVar3 = (local_48->linear_elements)._M_t.
                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl;
          prVar8 = local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            pfVar14 = (function_element *)((long)prVar8 + 4);
            fVar4 = pfVar2[uVar13];
            uVar13 = uVar13 + 1;
            pfVar14[-1].variable_index = (index)pfVar3[(long)fVar4 >> 0x20];
            *pfVar14 = fVar4;
            prVar8 = (pointer)(pfVar14 + 1);
          } while ((local_78 & 0xffffffff) != uVar13);
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,rng);
        prVar9 = local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        prVar8 = local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (int)LZCOUNT(((long)local_70.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_70.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                  -0x5555555555555555) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar8,prVar9);
        }
        pbVar10 = local_58;
        if ((local_58->m_data)._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar23 = (uint)local_78;
          if (-1 < (int)uVar23) {
            uVar13 = 0;
            iVar21 = 0;
            piVar15 = &(local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                        _M_impl.super__Vector_impl_data._M_start)->factor;
LAB_001589a1:
            if ((iVar21 < pmVar12->min) || (pmVar12->max < iVar21)) goto LAB_001589ab;
            if (-1 < (long)(uVar13 - 1)) {
              lVar18 = 8;
              uVar24 = uVar13;
              do {
                bit_array_impl::set(pbVar10,*(int *)((long)&(local_70.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                                  + lVar18));
                lVar18 = lVar18 + 0xc;
                uVar24 = uVar24 - 1;
              } while (uVar24 != 0);
              uVar23 = (uint)local_78;
              goto LAB_001589f9;
            }
          }
LAB_001589f6:
          uVar13 = 0;
LAB_001589f9:
          pbVar10 = local_58;
          if ((uint)uVar13 != uVar23) {
            lVar18 = (uVar13 & 0xffffffff) * 0xc + 8;
            lVar25 = (uVar13 & 0xffffffff) - (local_78 & 0xffffffff);
            do {
              bit_array_impl::unset
                        (pbVar10,*(int *)((long)&(local_70.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                         + lVar18));
              lVar18 = lVar18 + 0xc;
              lVar25 = lVar25 + 1;
            } while (lVar25 != 0);
          }
        }
        uVar13 = local_78;
        rng = local_50;
        if ((x_optimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar23 = (uint)local_78;
          if ((int)uVar23 < 0) {
LAB_00158aeb:
            uVar17 = 0;
          }
          else {
            uVar20 = (ulong)(uVar23 & 0x7fffffff);
            uVar22 = 0xffffffffffffffff;
            iVar21 = 0;
            piVar15 = &(local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                        _M_impl.super__Vector_impl_data._M_start)->factor;
            uVar24 = 0xfffffffe;
            do {
              uVar19 = uVar22 & 0xffffffff;
              if (pmVar12->max < iVar21) {
                uVar19 = uVar24;
              }
              if (iVar21 < pmVar12->min) {
                uVar19 = uVar24;
              }
              uVar22 = uVar22 + 1;
              iVar16 = (int)uVar19;
              if (((iVar16 != -2) && ((long)uVar22 < (long)uVar20)) &&
                 (0.0 < ((reduced_cost *)(piVar15 + -1))->value)) break;
              if ((long)uVar22 < (long)uVar20) {
                iVar21 = iVar21 + *piVar15;
              }
              piVar15 = piVar15 + 3;
              uVar24 = uVar19;
            } while (uVar20 != uVar22);
            if (iVar16 < 0) goto LAB_00158aeb;
            uVar17 = iVar16 + 1;
            lVar18 = 0;
            do {
              bit_array_impl::set(&x_optimistic->super_bit_array_impl,
                                  *(int *)((long)&(local_70.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id +
                                          lVar18));
              lVar18 = lVar18 + 0xc;
            } while (uVar19 * 0xc + 0xc != lVar18);
          }
          rng = local_50;
          if (uVar17 != uVar23) {
            lVar25 = (ulong)uVar17 - (uVar13 & 0xffffffff);
            lVar18 = (ulong)uVar17 * 0xc + 8;
            do {
              bit_array_impl::unset
                        (&x_optimistic->super_bit_array_impl,
                         *(int *)((long)&(local_70.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar18
                                 ));
              lVar18 = lVar18 + 0xc;
              lVar25 = lVar25 + 1;
            } while (lVar25 != 0);
          }
        }
      }
      pmVar12 = pmVar12 + 1;
      prVar11 = local_50;
    } while (pmVar12 != local_40);
  }
  if (local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
      super__Vector_impl_data._M_start != (reduced_cost *)0x0) {
    operator_delete(local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
LAB_001589ab:
  if ((long)uVar13 < (long)(ulong)(uVar23 & 0x7fffffff)) {
    iVar21 = iVar21 + *piVar15;
  }
  uVar13 = uVar13 + 1;
  piVar15 = piVar15 + 3;
  if ((ulong)(uVar23 & 0x7fffffff) + 1 == uVar13) goto LAB_001589f6;
  goto LAB_001589a1;
}

Assistant:

void
init_with_pre_solve(bit_array& x_pessimistic,
                    bit_array& x_optimistic,
                    random_engine& rng,
                    const Cost& c,
                    const std::vector<merged_constraint>& constraints,
                    const double init_random) noexcept
{
    int max_length = 0;
    for (const auto& cst : constraints)
        if (length(cst.elements) > max_length)
            max_length = length(cst.elements);

    struct reduced_cost
    {
        float value;
        int factor;
        int id;
    };

    std::vector<reduced_cost> R(max_length);
    std::bernoulli_distribution dist(init_random);

    for (const auto& cst : constraints) {
        if (!dist(rng))
            continue;

        R.resize(cst.elements.size());
        const int r_size = length(cst.elements);

        for (int i = 0; i != r_size; ++i) {
            R[i].value = static_cast<float>(c[cst.elements[i].variable_index]);
            R[i].factor = cst.elements[i].factor;
            R[i].id = cst.elements[i].variable_index;
        }

        std::shuffle(std::begin(R), std::end(R), rng);
        std::sort(
          std::begin(R), std::end(R), [](const auto& lhs, const auto& rhs) {
              return is_better_solution<Mode>(lhs.value, rhs.value);
          });

        if (!x_pessimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max) {
                    best = i;
                    break;
                }

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_pessimistic.set(R[i].id);

            for (; i != r_size; ++i) {
                x_pessimistic.unset(R[i].id);
            }
        }

        if (!x_optimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max)
                    best = i;

                if (best != -2 && i + 1 < r_size &&
                    stop_iterating<Mode>(R[i + 1].value))
                    break;

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_optimistic.set(R[i].id);

            for (; i != r_size; ++i)
                x_optimistic.unset(R[i].id);
        }
    }
}